

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::readSmf(MidiFile *this,istream *input)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  MidiEventList *pMVar7;
  undefined1 uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uchar runningCommand;
  ulong local_b0;
  string filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  
  this->m_rwstatus = true;
  std::__cxx11::string::string
            ((string *)&filename,(this->m_readFileName)._M_dataplus._M_p,(allocator *)&event);
  iVar4 = std::istream::get();
  if (iVar4 == 0x4d) {
    iVar4 = std::istream::get();
    if (iVar4 == 0x54) {
      iVar4 = std::istream::get();
      if (iVar4 == 0x68) {
        iVar4 = std::istream::get();
        if (iVar4 == 100) {
          uVar6 = readLittleEndian4Bytes(input);
          if (uVar6 == 6) {
            uVar3 = readLittleEndian2Bytes(input);
            if (uVar3 == 0) {
              bVar2 = true;
            }
            else {
              if (uVar3 != 1) {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle a type-");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
                poVar5 = std::operator<<(poVar5," MIDI file");
                std::endl<char,std::char_traits<char>>(poVar5);
                goto LAB_0011f0a6;
              }
              bVar2 = false;
            }
            uVar3 = readLittleEndian2Bytes(input);
            local_b0 = (ulong)uVar3;
            if (!bVar2 || uVar3 == 1) {
              clear(this);
              pMVar7 = *(this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pMVar7 != (MidiEventList *)0x0) {
                MidiEventList::~MidiEventList(pMVar7);
                operator_delete(pMVar7);
              }
              std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                        (&this->m_events,local_b0);
              for (uVar11 = 0; local_b0 != uVar11; uVar11 = uVar11 + 1) {
                pMVar7 = (MidiEventList *)operator_new(0x18);
                MidiEventList::MidiEventList(pMVar7);
                (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11] = pMVar7;
                MidiEventList::reserve
                          ((this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11],10000);
                MidiEventList::clear
                          ((this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11]);
              }
              uVar3 = readLittleEndian2Bytes(input);
              uVar10 = (uint)uVar3;
              if ((short)uVar3 < 0) {
                uVar1 = (uVar3 >> 8) + 0x1e;
                if ((byte)uVar1 < 7) {
                  if ((99U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0011f181;
                  iVar4 = *(int *)(&DAT_0012c6a8 + (ulong)(uVar1 & 0xff) * 4);
                }
                else {
LAB_0011f181:
                  poVar5 = std::operator<<((ostream *)&std::cerr,"Warning: unknown FPS: ");
                  iVar4 = 0x100 - (uint)(uVar3 >> 8);
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  poVar5 = std::operator<<((ostream *)&std::cerr,"Using non-standard FPS: ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
                  std::endl<char,std::char_traits<char>>(poVar5);
                }
                uVar10 = (uVar10 & 0xff) * iVar4;
              }
              this->m_ticksPerQuarterNote = uVar10;
              MidiEvent::MidiEvent(&event);
              bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (uVar11 = 0; uVar11 != local_b0; uVar11 = uVar11 + 1) {
                runningCommand = '\0';
                iVar4 = std::istream::get();
                if (iVar4 != 0x4d) {
                  if (iVar4 == -1) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5,": unexpected end of file.");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'M\' at first byte in track, but found nothing."
                                            );
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5," is not a MIDI file");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'M\' at first byte in track but got \'");
                    poVar5 = std::operator<<(poVar5,(char)iVar4);
                    poVar5 = std::operator<<(poVar5,"\'");
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
LAB_0011f677:
                  this->m_rwstatus = false;
                  uVar8 = 0;
                  goto LAB_0011f67d;
                }
                iVar4 = std::istream::get();
                if (iVar4 != 0x54) {
                  if (iVar4 == -1) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5,": unexpected end of file.");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'T\' at second byte in track, but found nothing."
                                            );
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5," is not a MIDI file");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'T\' at second byte in track but got \'");
                    poVar5 = std::operator<<(poVar5,(char)iVar4);
                    poVar5 = std::operator<<(poVar5,"\'");
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  goto LAB_0011f677;
                }
                iVar4 = std::istream::get();
                if (iVar4 != 0x72) {
                  if (iVar4 == -1) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5,": unexpected end of file.");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'r\' at third byte in track, but found nothing."
                                            );
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5," is not a MIDI file");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'r\' at third byte in track but got \'");
                    poVar5 = std::operator<<(poVar5,(char)iVar4);
                    poVar5 = std::operator<<(poVar5,"\'");
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  goto LAB_0011f677;
                }
                iVar4 = std::istream::get();
                if (iVar4 != 0x6b) {
                  if (iVar4 == -1) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5,": unexpected end of file.");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'k\' at fourth byte in track, but found nothing."
                                            );
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
                    poVar5 = std::operator<<(poVar5,(string *)&filename);
                    poVar5 = std::operator<<(poVar5," is not a MIDI file");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "Expecting \'k\' at fourth byte in track but got \'");
                    poVar5 = std::operator<<(poVar5,(char)iVar4);
                    poVar5 = std::operator<<(poVar5,"\'");
                    std::endl<char,std::char_traits<char>>(poVar5);
                  }
                  goto LAB_0011f677;
                }
                uVar6 = readLittleEndian4Bytes(input);
                MidiEventList::reserve
                          ((this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11],
                           (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 |
                                       uVar6 & 0xffffffff) / 2));
                MidiEventList::clear
                          ((this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11]);
                lVar9 = 0;
                while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
                  uVar6 = readVLValue(this,input);
                  iVar4 = extractMidiData(this,input,&bytes,&runningCommand);
                  if (iVar4 == 0) goto LAB_0011f677;
                  MidiMessage::setMessage(&event.super_MidiMessage,&bytes);
                  lVar9 = uVar6 + (long)(int)lVar9;
                  event.tick = (int)lVar9;
                  event.track = (int)uVar11;
                  if ((*bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0xff) &&
                     (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[1] == '/')) {
                    MidiEventList::push_back
                              ((this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar11],&event);
                    break;
                  }
                  MidiEventList::push_back
                            ((this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar11],&event);
                }
              }
              this->m_theTimeState = 1;
              markSequence(this);
              uVar8 = this->m_rwstatus;
LAB_0011f67d:
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              MidiEvent::~MidiEvent(&event);
              goto LAB_0011f0ac;
            }
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "Error: Type 0 MIDI file can only contain one track");
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&std::cerr,"Instead track count is: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)local_b0);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar5 = std::operator<<(poVar5,(string *)&filename);
            poVar5 = std::operator<<(poVar5," is not a MIDI 1.0 Standard MIDI file.");
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&std::cerr,"The header size is ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," bytes.");
            std::endl<char,std::char_traits<char>>(poVar5);
          }
        }
        else if (iVar4 == -1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar5 = std::operator<<(poVar5,(string *)&filename);
          poVar5 = std::operator<<(poVar5,": unexpected end of file.");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'d\' at fourth byte, but found nothing.");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar5 = std::operator<<(poVar5,(string *)&filename);
          poVar5 = std::operator<<(poVar5," is not a MIDI file");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'"
                                  );
          poVar5 = std::operator<<(poVar5,(char)iVar4);
          poVar5 = std::operator<<(poVar5,"\'");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      else if (iVar4 == -1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar5 = std::operator<<(poVar5,(string *)&filename);
        poVar5 = std::operator<<(poVar5,": unexpected end of file.");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'h\' at third byte, but found nothing.");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar5 = std::operator<<(poVar5,(string *)&filename);
        poVar5 = std::operator<<(poVar5," is not a MIDI file");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'");
        poVar5 = std::operator<<(poVar5,(char)iVar4);
        poVar5 = std::operator<<(poVar5,"\'");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    else if (iVar4 == -1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
      poVar5 = std::operator<<(poVar5,(string *)&filename);
      poVar5 = std::operator<<(poVar5,": unexpected end of file.");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Expecting \'T\' at second byte, but found nothing.");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar5 = std::operator<<(poVar5,(string *)&filename);
      poVar5 = std::operator<<(poVar5," is not a MIDI file");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'");
      poVar5 = std::operator<<(poVar5,(char)iVar4);
      poVar5 = std::operator<<(poVar5,"\'");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else if (iVar4 == -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"In file ");
    poVar5 = std::operator<<(poVar5,(string *)&filename);
    poVar5 = std::operator<<(poVar5,": unexpected end of file.");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "Expecting \'M\' at first byte, but found nothing.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
    poVar5 = std::operator<<(poVar5,(string *)&filename);
    poVar5 = std::operator<<(poVar5," is not a MIDI file");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'");
    poVar5 = std::operator<<(poVar5,(char)iVar4);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
LAB_0011f0a6:
  this->m_rwstatus = false;
  uVar8 = 0;
LAB_0011f0ac:
  std::__cxx11::string::~string((string *)&filename);
  return (bool)uVar8;
}

Assistant:

bool MidiFile::readSmf(std::istream& input) {
	m_rwstatus = true;

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;

	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// Set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// Read MIDI events in the track, which are pairs of VLV values
		// and then the bytes for the MIDI message.  Running status messages
		// will be filled in with their implicit command byte.
		// The timestamps are converted from delta ticks to absolute ticks,
		// with the absticks variable accumulating the VLV tick values.
		int absticks = 0;
		while (!input.eof()) {
			longdata = readVLValue(input);
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false; return m_rwstatus;
			}
			event.setMessage(bytes);
			event.tick = absticks;
			event.track = i;

			if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end-of-track message
				// comment out the following line if you don't want to see the
				// end of track message (which is always required, and will added
				// automatically when a MIDI is written, so it is not necessary.
				m_events[i]->push_back(event);
				break;
			}
			m_events[i]->push_back(event);
		}
	}

	m_theTimeState = TIME_STATE_ABSOLUTE;

	// The original order of the MIDI events is marked with an enumeration which
	// allows for reconstruction of the order when merging/splitting tracks to/from
	// a type-0 configuration.
	markSequence();

	return m_rwstatus;
}